

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O3

Map * __thiscall MapLoader::readMapFile(MapLoader *this)

{
  pointer pbVar1;
  pointer pcVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  string *mapName;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *continentData;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *countryData;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *borderData;
  string *mode;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  int *lineCount;
  int *countryID;
  int *continentCount;
  int *countryCount;
  istream *piVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pLineWords;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var9;
  vector<int,_std::allocator<int>_> *lineNums;
  Map *pMVar10;
  _Alloc_hider this_00;
  string *this_01;
  MapLoader *this_02;
  undefined1 local_2c1;
  bool *local_2c0;
  int local_2b4;
  Map *local_2b0;
  string line;
  ifstream infile;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&infile,(string *)this->pMapFile,_S_in);
  if ((abStack_218[*(long *)(_infile + -0x18)] & 5) == 0) {
    iVar5 = std::istream::peek();
    if (iVar5 != -1) {
      line._M_dataplus._M_p = (pointer)&line.field_2;
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      mapName = (string *)operator_new(0x20);
      (mapName->_M_dataplus)._M_p = (pointer)&mapName->field_2;
      mapName->_M_string_length = 0;
      (mapName->field_2)._M_local_buf[0] = '\0';
      continentData =
           (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)operator_new(0x18);
      (continentData->
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (continentData->
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (continentData->
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      countryData = (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)operator_new(0x18);
      (countryData->
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (countryData->
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (countryData->
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      borderData = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)operator_new(0x18);
      (borderData->
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (borderData->
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (borderData->
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      mode = (string *)operator_new(0x20);
      paVar7 = &mode->field_2;
      (mode->_M_dataplus)._M_p = (pointer)paVar7;
      mode->_M_string_length = 0;
      (mode->field_2)._M_local_buf[0] = '\0';
      lineCount = (int *)operator_new(4);
      *lineCount = 0;
      countryID = (int *)operator_new(4);
      *countryID = 1;
      continentCount = (int *)operator_new(4);
      *continentCount = 0;
      countryCount = (int *)operator_new(4);
      *countryCount = 0;
      local_2c0 = (bool *)operator_new(1);
      *local_2c0 = true;
      local_2b0 = (Map *)0x0;
      local_2b4 = 0;
      iVar5 = 0;
LAB_0010b09c:
      iVar5 = iVar5 + 1;
      cVar3 = std::ios::widen((char)*(undefined8 *)(_infile + -0x18) + (char)(istream *)&infile);
      piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&infile,(string *)&line,cVar3);
      if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) == 0) {
        *lineCount = iVar5;
        pLineWords = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)operator_new(0x18);
        (pLineWords->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pLineWords->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pLineWords->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if ((line._M_string_length != 0) &&
           ((0x3b < (ulong)(byte)*line._M_dataplus._M_p ||
            ((0x800000000002400U >> ((ulong)(byte)*line._M_dataplus._M_p & 0x3f) & 1) == 0)))) {
          local_2c1 = 10;
          _Var9 = std::
                  __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                            ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )line._M_dataplus._M_p,
                             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )(line._M_dataplus._M_p + line._M_string_length),
                             (_Iter_equals_val<const_char>)&local_2c1);
          line._M_string_length = (long)_Var9._M_current - (long)line._M_dataplus._M_p;
          *_Var9._M_current = '\0';
          local_2c1 = 0xd;
          this_00 = line._M_dataplus;
          _Var9 = std::
                  __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                            ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )line._M_dataplus._M_p,
                             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )(line._M_dataplus._M_p + line._M_string_length),
                             (_Iter_equals_val<const_char>)&local_2c1);
          line._M_string_length = (long)_Var9._M_current - (long)line._M_dataplus._M_p;
          *_Var9._M_current = '\0';
          splitLine((MapLoader *)this_00._M_p,&line,pLineWords);
          getMapName((MapLoader *)this_00._M_p,mapName,pLineWords);
          bVar4 = checkSection((MapLoader *)this_00._M_p,mode,pLineWords);
          if (!bVar4) {
            iVar6 = std::__cxx11::string::compare((char *)mode);
            if (iVar6 != 0) {
              iVar6 = std::__cxx11::string::compare((char *)mode);
              if (iVar6 == 0) {
                local_2b4 = local_2b4 + 1;
                *continentCount = local_2b4;
                if ((ulong)((long)(pLineWords->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pLineWords->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
                  *local_2c0 = false;
                  goto LAB_0010b464;
                }
                std::
                vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::push_back(continentData,pLineWords);
              }
              else {
                this_01 = mode;
                iVar6 = std::__cxx11::string::compare((char *)mode);
                if (iVar6 == 0) {
                  bVar4 = validateCountryLine((MapLoader *)this_01,countryCount,pLineWords,lineCount
                                              ,local_2c0,countryID,continentCount,false);
                  if (!bVar4) goto LAB_0010b46d;
                  std::
                  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::push_back(countryData,pLineWords);
                }
                else {
                  iVar6 = std::__cxx11::string::compare((char *)mode);
                  if (iVar6 == 0) {
                    this_02 = (MapLoader *)0x18;
                    lineNums = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
                    (lineNums->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start = (pointer)0x0;
                    (lineNums->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)0x0;
                    (lineNums->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    bVar4 = validateBordersLine(this_02,lineNums,pLineWords,lineCount,local_2c0,
                                                countryCount,false);
                    if (!bVar4) goto LAB_0010b46d;
                    std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::push_back(borderData,lineNums);
                  }
                  else {
                    pbVar1 = (pLineWords->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start;
                    if ((pLineWords->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish == pbVar1) {
                      std::__throw_out_of_range_fmt
                                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                 ,0,0);
                    }
                    iVar6 = std::__cxx11::string::compare((char *)pbVar1);
                    if (iVar6 == 0) goto LAB_0010b09c;
                  }
                }
              }
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(pLineWords);
            operator_delete(pLineWords,0x18);
          }
        }
        goto LAB_0010b09c;
      }
      local_2b0 = initMapObject(mapName,continentData,countryData,borderData,local_2c0);
      pcVar2 = (mode->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar7) {
        operator_delete(pcVar2,paVar7->_M_allocated_capacity + 1);
      }
      operator_delete(mode,0x20);
      operator_delete(lineCount,4);
      operator_delete(continentCount,4);
      operator_delete(countryCount,4);
      operator_delete(countryID,4);
      if ((((*local_2c0 == true) &&
           ((continentData->
            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start !=
            (continentData->
            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish)) &&
          ((countryData->
           super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start !=
           (countryData->
           super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish)) &&
         ((borderData->
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start !=
          (borderData->
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish)) {
        operator_delete(local_2c0,1);
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector(continentData);
        operator_delete(continentData,0x18);
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector(countryData);
        operator_delete(countryData,0x18);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector(borderData);
        operator_delete(borderData,0x18);
      }
      else {
        operator_delete(local_2c0,1);
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector(continentData);
        operator_delete(continentData,0x18);
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector(countryData);
        operator_delete(countryData,0x18);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector(borderData);
        operator_delete(borderData,0x18);
LAB_0010b464:
        local_2b0 = (Map *)0x0;
      }
LAB_0010b46d:
      pMVar10 = local_2b0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)line._M_dataplus._M_p != &line.field_2) {
        operator_delete(line._M_dataplus._M_p,
                        CONCAT71(line.field_2._M_allocated_capacity._1_7_,
                                 line.field_2._M_local_buf[0]) + 1);
        pMVar10 = local_2b0;
      }
      goto LAB_0010b48e;
    }
  }
  pMVar10 = (Map *)0x0;
LAB_0010b48e:
  std::ifstream::~ifstream(&infile);
  return pMVar10;
}

Assistant:

Map* MapLoader::readMapFile() {
    //for debug purposes, change to true to print errors and warnings
    bool verbose = false;
    //create file stream to read file line by line
    std::ifstream infile(*pMapFile);
    if(!infile || infile.peek() == EOF){
        return nullptr;
    }
    std::string line;

    //declare map info
    auto* pMapName = new std::string;
    auto* pContinentData = new std::vector<std::vector<std::string>>;
    auto* pCountryData = new std::vector<std::vector<std::string>>;
    auto* pBorderData = new std::vector<std::vector<int>>;
    auto* pMode = new std::string;

    //maintain counters for validation / error tracing
    auto* pLineCount = new int(0);
    auto* pCountryID = new int(1);
    auto* pContinentCount = new int(0);
    auto* pCountryCount = new int(0);
    auto* pValidMap = new bool(true);

    while (std::getline(infile, line)) {
        (*pLineCount)++;
        //will hold the words of each line (separated by spaces) in an array
        auto* pLineWords = new std::vector<std::string>;
        //ignore comments or empty lines
        if (line.empty() || line[0] == *";" || line[0] == *"\n" || line[0] == *"\r") {
            //do nothing, the line is empty or is a comment
            continue;
        } else {
            // strip every line of the \n and \r characters
            line.erase(std::remove(line.begin(), line.end(), '\n'), line.end());
            line.erase(std::remove(line.begin(), line.end(), '\r'), line.end());
            splitLine(line, pLineWords);
            getMapName(pMapName, pLineWords);

            if (checkSection(pMode, pLineWords)) {
                continue;
            }

            //read sections
            if (*pMode == "files") {
                //this mode is in every example file, do we need it?
                if(verbose){
                    std::cout << "Line " << *pLineCount
                              << " - [WARNING] : the parser encountered the file mode, which is not supported at the moment.\n";
                }
            } else if (*pMode == "continents") {
                if (validateContinentLine(pContinentCount, pLineWords, pLineCount, pValidMap,verbose)) {
                    pContinentData->push_back(*pLineWords);
                } else {
                    return nullptr;
                }
            } else if (*pMode == "countries") {
                if (validateCountryLine(pCountryCount, pLineWords, pLineCount, pValidMap, pCountryID,
                                        pContinentCount,verbose)) {
                    pCountryData->push_back(*pLineWords);
                } else {
                    return nullptr;
                }
            } else if (*pMode == "borders") {
                auto* pLineNums = new std::vector<int>;
                if (validateBordersLine(pLineNums, pLineWords, pLineCount, pValidMap, pCountryCount,verbose)) {
                    pBorderData->push_back(*pLineNums);
                } else {
                    return nullptr;
                }
            } else if (pLineWords->at(0) == "name") {
                continue;
            } else {
                //unknown mode error, will be ignored, non-critical
                if(verbose){
                    std::cout << "\nLine " << *pLineCount << " - [WARNING] : the parser encountered an unknown mode. ";
                    std::cout << " ::  " << line;
                }
            }
        }
        delete (pLineWords);
    }
    //create map object

    auto* map = initMapObject(pMapName, pContinentData, pCountryData, pBorderData, pValidMap);

    //clean up
    delete (pMode);
    delete (pLineCount);
    delete (pContinentCount);
    delete (pCountryCount);
    delete (pCountryID);

    if(!*pValidMap || pContinentData->empty() || pCountryData->empty() || pBorderData->empty()){
        delete (pValidMap);
        delete (pContinentData);
        delete (pCountryData);
        delete (pBorderData);
        return nullptr;
    }
    delete (pValidMap);
    delete (pContinentData);
    delete (pCountryData);
    delete (pBorderData);
    return map;
}